

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_OES_viewport_array(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_OES_viewport_array != 0) {
    glad_glViewportArrayvOES = (PFNGLVIEWPORTARRAYVOESPROC)(*in_RDI)("glViewportArrayvOES");
    glad_glViewportIndexedfOES = (PFNGLVIEWPORTINDEXEDFOESPROC)(*in_RDI)("glViewportIndexedfOES");
    glad_glViewportIndexedfvOES = (PFNGLVIEWPORTINDEXEDFVOESPROC)(*in_RDI)("glViewportIndexedfvOES")
    ;
    glad_glScissorArrayvOES = (PFNGLSCISSORARRAYVOESPROC)(*in_RDI)("glScissorArrayvOES");
    glad_glScissorIndexedOES = (PFNGLSCISSORINDEXEDOESPROC)(*in_RDI)("glScissorIndexedOES");
    glad_glScissorIndexedvOES = (PFNGLSCISSORINDEXEDVOESPROC)(*in_RDI)("glScissorIndexedvOES");
    glad_glDepthRangeArrayfvOES = (PFNGLDEPTHRANGEARRAYFVOESPROC)(*in_RDI)("glDepthRangeArrayfvOES")
    ;
    glad_glDepthRangeIndexedfOES =
         (PFNGLDEPTHRANGEINDEXEDFOESPROC)(*in_RDI)("glDepthRangeIndexedfOES");
    glad_glGetFloati_vOES = (PFNGLGETFLOATI_VOESPROC)(*in_RDI)("glGetFloati_vOES");
    glad_glEnableiOES = (PFNGLENABLEIOESPROC)(*in_RDI)("glEnableiOES");
    glad_glDisableiOES = (PFNGLDISABLEIOESPROC)(*in_RDI)("glDisableiOES");
    glad_glIsEnablediOES = (PFNGLISENABLEDIOESPROC)(*in_RDI)("glIsEnablediOES");
  }
  return;
}

Assistant:

static void load_GL_OES_viewport_array(GLADloadproc load) {
	if(!GLAD_GL_OES_viewport_array) return;
	glad_glViewportArrayvOES = (PFNGLVIEWPORTARRAYVOESPROC)load("glViewportArrayvOES");
	glad_glViewportIndexedfOES = (PFNGLVIEWPORTINDEXEDFOESPROC)load("glViewportIndexedfOES");
	glad_glViewportIndexedfvOES = (PFNGLVIEWPORTINDEXEDFVOESPROC)load("glViewportIndexedfvOES");
	glad_glScissorArrayvOES = (PFNGLSCISSORARRAYVOESPROC)load("glScissorArrayvOES");
	glad_glScissorIndexedOES = (PFNGLSCISSORINDEXEDOESPROC)load("glScissorIndexedOES");
	glad_glScissorIndexedvOES = (PFNGLSCISSORINDEXEDVOESPROC)load("glScissorIndexedvOES");
	glad_glDepthRangeArrayfvOES = (PFNGLDEPTHRANGEARRAYFVOESPROC)load("glDepthRangeArrayfvOES");
	glad_glDepthRangeIndexedfOES = (PFNGLDEPTHRANGEINDEXEDFOESPROC)load("glDepthRangeIndexedfOES");
	glad_glGetFloati_vOES = (PFNGLGETFLOATI_VOESPROC)load("glGetFloati_vOES");
	glad_glEnableiOES = (PFNGLENABLEIOESPROC)load("glEnableiOES");
	glad_glDisableiOES = (PFNGLDISABLEIOESPROC)load("glDisableiOES");
	glad_glIsEnablediOES = (PFNGLISENABLEDIOESPROC)load("glIsEnablediOES");
}